

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintCharAndCodeTo<unsigned_char,signed_char>(char c,ostream *os)

{
  bool bVar1;
  long *plVar2;
  size_type *psVar3;
  int value;
  int value_00;
  long lVar4;
  int iVar5;
  char *pcVar6;
  undefined7 in_register_00000039;
  string local_60;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  iVar5 = (int)CONCAT71(in_register_00000039,c);
  switch(CONCAT71(in_register_00000039,c) & 0xffffffff) {
  case 0:
    pcVar6 = "\\0";
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_00132ee0_caseD_1:
    if (0x5e < (int)c - 0x20U) {
      String::FormatHexInt_abi_cxx11_(&local_40,(String *)(ulong)(byte)c,value);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x13aeea);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_60.field_2._M_allocated_capacity = *psVar3;
        local_60.field_2._8_8_ = plVar2[3];
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      }
      else {
        local_60.field_2._M_allocated_capacity = *psVar3;
        local_60._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_60._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_60._M_dataplus._M_p,local_60._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      bVar1 = true;
      goto LAB_00132f73;
    }
    pcVar6 = (char *)&local_60;
    local_60._M_dataplus._M_p._0_1_ = c;
    lVar4 = 1;
    goto LAB_00132f68;
  case 7:
    pcVar6 = "\\a";
    break;
  case 8:
    pcVar6 = "\\b";
    break;
  case 9:
    pcVar6 = "\\t";
    break;
  case 10:
    pcVar6 = "\\n";
    break;
  case 0xb:
    pcVar6 = "\\v";
    break;
  case 0xc:
    pcVar6 = "\\f";
    break;
  case 0xd:
    pcVar6 = "\\r";
    break;
  default:
    if (iVar5 == 0x27) {
      pcVar6 = "\\\'";
    }
    else {
      if (iVar5 != 0x5c) goto switchD_00132ee0_caseD_1;
      pcVar6 = "\\\\";
    }
  }
  lVar4 = 2;
LAB_00132f68:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar4);
  bVar1 = false;
LAB_00132f73:
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  if (c != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    std::ostream::operator<<((ostream *)os,(int)c);
    if (9 < (byte)c && !bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", 0x",4);
      String::FormatHexInt_abi_cxx11_(&local_60,(String *)(ulong)(byte)c,value_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_60._M_dataplus._M_p,local_60._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<UnsignedChar>(c));
  }
  *os << ")";
}